

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O3

void __thiscall
irr::scene::CAnimatedMeshSceneNode::buildFrameNr(CAnimatedMeshSceneNode *this,u32 timeMs)

{
  int iVar1;
  int iVar2;
  IAnimationEndCallBack *pIVar3;
  int iVar4;
  f32 fVar5;
  float fVar6;
  float fVar7;
  
  fVar7 = (float)this->Transiting;
  if (((fVar7 != 0.0) || (NAN(fVar7))) &&
     (fVar7 = (float)timeMs * fVar7 + (float)this->TransitingBlend,
     this->TransitingBlend = (f32)fVar7, 1.0 < fVar7)) {
    this->Transiting = 0.0;
    this->TransitingBlend = 0.0;
  }
  iVar1 = this->StartFrame;
  iVar2 = this->EndFrame;
  iVar4 = iVar2 - iVar1;
  if (iVar4 == 0) {
    fVar5 = (f32)(float)iVar1;
  }
  else {
    fVar7 = (float)this->FramesPerSecond;
    fVar6 = (float)timeMs * fVar7 + (float)this->CurrentFrameNr;
    this->CurrentFrameNr = (f32)fVar6;
    if (this->Looping != true) {
      if (fVar7 <= 0.0) {
        fVar5 = (f32)(float)iVar1;
        if ((float)fVar5 <= fVar6) {
          return;
        }
      }
      else {
        fVar5 = (f32)(float)iVar2;
        if (fVar6 <= (float)fVar5) {
          return;
        }
      }
      this->CurrentFrameNr = fVar5;
      pIVar3 = this->LoopCallBack;
      if (pIVar3 == (IAnimationEndCallBack *)0x0) {
        return;
      }
      (*(code *)**(undefined8 **)pIVar3)(pIVar3,this);
      return;
    }
    if (fVar7 <= 0.0) {
      if ((float)iVar1 <= fVar6) {
        return;
      }
      fVar7 = fmodf((float)iVar2 - fVar6,(float)iVar4);
      this->CurrentFrameNr = (f32)((float)iVar2 - fVar7);
      return;
    }
    if (fVar6 <= (float)iVar2) {
      return;
    }
    fVar7 = fmodf(fVar6 - (float)iVar1,(float)iVar4);
    fVar5 = (f32)(fVar7 + (float)iVar1);
  }
  this->CurrentFrameNr = fVar5;
  return;
}

Assistant:

void CAnimatedMeshSceneNode::buildFrameNr(u32 timeMs)
{
	if (Transiting != 0.f) {
		TransitingBlend += (f32)(timeMs)*Transiting;
		if (TransitingBlend > 1.f) {
			Transiting = 0.f;
			TransitingBlend = 0.f;
		}
	}

	if (StartFrame == EndFrame) {
		CurrentFrameNr = (f32)StartFrame; // Support for non animated meshes
	} else if (Looping) {
		// play animation looped
		CurrentFrameNr += timeMs * FramesPerSecond;

		// We have no interpolation between EndFrame and StartFrame,
		// the last frame must be identical to first one with our current solution.
		if (FramesPerSecond > 0.f) { // forwards...
			if (CurrentFrameNr > EndFrame)
				CurrentFrameNr = StartFrame + fmodf(CurrentFrameNr - StartFrame, (f32)(EndFrame - StartFrame));
		} else // backwards...
		{
			if (CurrentFrameNr < StartFrame)
				CurrentFrameNr = EndFrame - fmodf(EndFrame - CurrentFrameNr, (f32)(EndFrame - StartFrame));
		}
	} else {
		// play animation non looped

		CurrentFrameNr += timeMs * FramesPerSecond;
		if (FramesPerSecond > 0.f) { // forwards...
			if (CurrentFrameNr > (f32)EndFrame) {
				CurrentFrameNr = (f32)EndFrame;
				if (LoopCallBack)
					LoopCallBack->OnAnimationEnd(this);
			}
		} else // backwards...
		{
			if (CurrentFrameNr < (f32)StartFrame) {
				CurrentFrameNr = (f32)StartFrame;
				if (LoopCallBack)
					LoopCallBack->OnAnimationEnd(this);
			}
		}
	}
}